

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_c_api_usecase1.cpp
# Opt level: O1

void call_server1(void)

{
  bool bVar1;
  size_t buffer_size;
  char *buffer;
  char_array_list data;
  size_t local_38;
  char *local_30;
  flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
  local_28;
  
  local_30 = (char *)0x0;
  local_38 = 0;
  bVar1 = server_api_call1(&local_30,&local_38);
  if (bVar1) {
    local_28.buffer_.v1_._M_resource = &global_memory_resource.super_memory_resource;
    local_28.buffer_.v2_.begin = (pointer_type)0x0;
    local_28.buffer_.v2_.last = (pointer_type)0x0;
    local_28.buffer_.v2_.end = (pointer_type)0x0;
    iffl::
    flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
    ::attach(&local_28,local_30,local_38);
    process_data1(&local_28);
    iffl::
    flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
    ::clear(&local_28);
  }
  else if ((local_30 != (char *)0x0) || (local_38 != 0)) {
    std::terminate();
  }
  return;
}

Assistant:

void call_server1() {
    char *buffer{ nullptr };
    size_t buffer_size{ 0 };

    if (server_api_call1(&buffer, &buffer_size)) {
        //
        // If server call succeeded the 
        // take ownership of the buffer
        //
        char_array_list data{ iffl::attach_buffer{},
                              buffer, 
                              buffer_size,
                              &global_memory_resource };
        process_data1(data);
    } else {
        FFL_CODDING_ERROR_IF(buffer || buffer_size);
    }
}